

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

ssize_t ossl_recv(connectdata *conn,int num,char *buf,size_t buffersize,CURLcode *curlcode)

{
  Curl_easy *data;
  int iVar1;
  ulong error;
  uint *puVar2;
  char *local_168;
  int local_154;
  int err;
  int buffsize;
  ssize_t nread;
  unsigned_long sslerror;
  char error_buffer [256];
  CURLcode *curlcode_local;
  size_t buffersize_local;
  char *buf_local;
  int num_local;
  connectdata *conn_local;
  
  error_buffer._248_8_ = curlcode;
  ERR_clear_error();
  if (buffersize < 0x80000000) {
    local_154 = (int)buffersize;
  }
  else {
    local_154 = 0x7fffffff;
  }
  iVar1 = SSL_read((SSL *)conn->ssl[num].handle,buf,local_154);
  conn_local = (connectdata *)(long)iVar1;
  if (((long)conn_local < 1) &&
     (iVar1 = SSL_get_error((SSL *)conn->ssl[num].handle,iVar1), iVar1 != 0)) {
    if (iVar1 - 2U < 2) {
      *(undefined4 *)error_buffer._248_8_ = 0x51;
      conn_local = (connectdata *)0xffffffffffffffff;
    }
    else if ((iVar1 != 6) && ((error = ERR_get_error(), (long)conn_local < 0 || (error != 0)))) {
      data = conn->data;
      if (error == 0) {
        local_168 = SSL_ERROR_to_str(iVar1);
      }
      else {
        local_168 = ossl_strerror(error,(char *)&sslerror,0x100);
      }
      puVar2 = (uint *)__errno_location();
      Curl_failf(data,"OpenSSL SSL_read: %s, errno %d",local_168,(ulong)*puVar2);
      *(undefined4 *)error_buffer._248_8_ = 0x38;
      conn_local = (connectdata *)0xffffffffffffffff;
    }
  }
  return (ssize_t)conn_local;
}

Assistant:

static ssize_t ossl_recv(struct connectdata *conn, /* connection data */
                         int num,                  /* socketindex */
                         char *buf,                /* store read data here */
                         size_t buffersize,        /* max amount to read */
                         CURLcode *curlcode)
{
  char error_buffer[256];
  unsigned long sslerror;
  ssize_t nread;
  int buffsize;

  ERR_clear_error();

  buffsize = (buffersize > (size_t)INT_MAX) ? INT_MAX : (int)buffersize;
  nread = (ssize_t)SSL_read(conn->ssl[num].handle, buf, buffsize);
  if(nread <= 0) {
    /* failed SSL_read */
    int err = SSL_get_error(conn->ssl[num].handle, (int)nread);

    switch(err) {
    case SSL_ERROR_NONE: /* this is not an error */
    case SSL_ERROR_ZERO_RETURN: /* no more data */
      break;
    case SSL_ERROR_WANT_READ:
    case SSL_ERROR_WANT_WRITE:
      /* there's data pending, re-invoke SSL_read() */
      *curlcode = CURLE_AGAIN;
      return -1;
    default:
      /* openssl/ssl.h for SSL_ERROR_SYSCALL says "look at error stack/return
         value/errno" */
      /* https://www.openssl.org/docs/crypto/ERR_get_error.html */
      sslerror = ERR_get_error();
      if((nread < 0) || sslerror) {
        /* If the return code was negative or there actually is an error in the
           queue */
        failf(conn->data, OSSL_PACKAGE " SSL_read: %s, errno %d",
              (sslerror ?
               ossl_strerror(sslerror, error_buffer, sizeof(error_buffer)) :
               SSL_ERROR_to_str(err)),
              SOCKERRNO);
        *curlcode = CURLE_RECV_ERROR;
        return -1;
      }
    }
  }
  return nread;
}